

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeReader::SetCurrentRelativeOffset(ByteCodeReader *this,byte *ip,int byteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = this->m_endLocation;
  if (pbVar4 <= ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xdd,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar2) goto LAB_0086abc1;
    *puVar3 = 0;
    pbVar4 = this->m_endLocation;
  }
  pbVar5 = ip + byteOffset;
  if (pbVar4 <= pbVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xdf,"(targetip < m_endLocation)","targetip < m_endLocation");
    if (!bVar2) {
LAB_0086abc1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->m_currentLocation = pbVar5;
  return pbVar5;
}

Assistant:

const byte * ByteCodeReader::SetCurrentRelativeOffset(const byte * ip, int byteOffset)
    {
        Assert(ip < m_endLocation);
        const byte * targetip = ip + byteOffset;
        Assert(targetip < m_endLocation);
        m_currentLocation = targetip;
        return targetip;
    }